

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O3

exr_result_t exr_uncompress_chunk(exr_decode_pipeline_t *decode)

{
  exr_const_context_t_conflict ctxt;
  exr_priv_part_t p_Var1;
  size_t unpacksz;
  exr_result_t eVar2;
  exr_result_t eVar3;
  long lVar4;
  size_t sVar5;
  
  eVar2 = 2;
  if (decode != (exr_decode_pipeline_t *)0x0) {
    decode->bytes_decompressed = 0;
    ctxt = decode->context;
    if (ctxt != (exr_const_context_t_conflict)0x0) {
      lVar4 = (long)decode->part_index;
      if ((lVar4 < 0) || (ctxt->num_parts <= decode->part_index)) {
        eVar2 = (*ctxt->print_error)(ctxt,4,"Part index (%d) out of range",lVar4,ctxt->print_error);
        return eVar2;
      }
      p_Var1 = ctxt->parts[lVar4];
      if (decode->packed_sample_count_table != (void *)0x0) {
        sVar5 = (long)(decode->chunk).height * (long)(decode->chunk).width * 4;
        eVar2 = decompress_data(ctxt,p_Var1->comp_type,decode,decode->packed_sample_count_table,
                                (decode->chunk).sample_count_table_size,decode->sample_count_table,
                                sVar5);
        if (eVar2 != 0) {
          eVar2 = (*ctxt->print_error)
                            (ctxt,eVar2,"Unable to decompress sample table %lu -> %lu",
                             (decode->chunk).sample_count_table_size,sVar5,ctxt->print_error);
          return eVar2;
        }
      }
      eVar3 = 0;
      eVar2 = 0;
      if (((((decode->decode_flags & 4) == 0) &&
           (sVar5 = (decode->chunk).packed_size, eVar2 = eVar3, sVar5 != 0)) &&
          (unpacksz = (decode->chunk).unpacked_size, unpacksz != 0)) &&
         (eVar3 = decompress_data(ctxt,p_Var1->comp_type,decode,decode->packed_buffer,sVar5,
                                  decode->unpacked_buffer,unpacksz), eVar3 != 0)) {
        eVar2 = (*ctxt->print_error)
                          (ctxt,eVar3,"Unable to decompress w %d image data %lu -> %lu, got %lu",
                           (ulong)p_Var1->comp_type,(decode->chunk).packed_size,
                           (decode->chunk).unpacked_size,decode->bytes_decompressed);
      }
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_uncompress_chunk (exr_decode_pipeline_t* decode)
{
    exr_result_t    rv   = EXR_ERR_SUCCESS;
    exr_context_t   ctxt;
    exr_priv_part_t part;

    if (!decode) return EXR_ERR_MISSING_CONTEXT_ARG;

    decode->bytes_decompressed = 0;

    ctxt = (exr_context_t)decode->context;
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    /* TODO: Double check need for a lock? */
    if (decode->part_index < 0 || decode->part_index >= ctxt->num_parts)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Part index (%d) out of range",
            decode->part_index);

    part = ctxt->parts[decode->part_index];

//    if (decode->chunk.unpacked_size != part->unpacked_size_per_chunk)
//        return ctxt->print_error (
//            ctxt,
//            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
//            "Memory not sufficient to unpack a full part, expect %" PRIu64 ", given %" PRIu64,
//            part->unpacked_size_per_chunk,
//            decode->chunk.unpacked_size);

    if (decode->packed_sample_count_table)
    {
        uint64_t sampsize =
            (((uint64_t) decode->chunk.width) *
             ((uint64_t) decode->chunk.height));

        sampsize *= sizeof (int32_t);

        rv = decompress_data (
            ctxt,
            part->comp_type,
            decode,
            decode->packed_sample_count_table,
            decode->chunk.sample_count_table_size,
            decode->sample_count_table,
            sampsize);

        if (rv != EXR_ERR_SUCCESS)
        {
            return ctxt->print_error (
                ctxt,
                rv,
                "Unable to decompress sample table %" PRIu64 " -> %" PRIu64,
                decode->chunk.sample_count_table_size,
                (uint64_t) sampsize);
        }
    }

    if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY)) return rv;

    if (rv == EXR_ERR_SUCCESS &&
        decode->chunk.packed_size > 0 &&
        decode->chunk.unpacked_size > 0)
        rv = decompress_data (
            ctxt,
            part->comp_type,
            decode,
            decode->packed_buffer,
            decode->chunk.packed_size,
            decode->unpacked_buffer,
            decode->chunk.unpacked_size);

    if (rv != EXR_ERR_SUCCESS)
    {
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to decompress w %d image data %" PRIu64 " -> %" PRIu64 ", got %" PRIu64,
            (int)part->comp_type,
            decode->chunk.packed_size,
            decode->chunk.unpacked_size,
            decode->bytes_decompressed);
    }
    return rv;
}